

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

type fmt::v5::
     visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (precision_checker<fmt::v5::internal::error_handler> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *arg)

{
  type tVar1;
  format_error *this;
  
  switch(arg->type_) {
  case named_arg_type:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/include/fmt/format.h"
                  ,0x496,
                  "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, const basic_format_arg<Context> &) [Visitor = fmt::internal::precision_checker<fmt::internal::error_handler>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                 );
  case int_type:
    tVar1 = (type)(arg->value_).field_0.int_value;
    if (-1 < (long)tVar1) {
      return tVar1;
    }
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"negative precision");
    break;
  case uint_type:
    return (ulong)(arg->value_).field_0.uint_value;
  case long_long_type:
    tVar1 = (arg->value_).field_0.long_long_value;
    if (-1 < (long)tVar1) {
      return tVar1;
    }
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"negative precision");
    break;
  case ulong_long_type:
    return (arg->value_).field_0.long_long_value;
  case bool_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case char_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case double_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case last_numeric_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case cstring_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case string_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case pointer_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  case custom_type:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    break;
  default:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
  }
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}